

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

int __thiscall BenevolentBotStrategy::defendNumDice(BenevolentBotStrategy *this)

{
  int iVar1;
  int local_14;
  int numDice;
  BenevolentBotStrategy *this_local;
  
  iVar1 = Map::Country::getNumberOfTroops((this->super_PlayerStrategy).to);
  if (iVar1 < 2) {
    local_14 = 1;
  }
  else {
    local_14 = 2;
  }
  return local_14;
}

Assistant:

int BenevolentBotStrategy::defendNumDice() {
    int numDice = 0;
    if (to->getNumberOfTroops() >= 2) {
        numDice = 2;
    }
    else {
        numDice = 1;
    }
    return numDice;
}